

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

time_t parse_time(char *p,size_t n)

{
  long lVar1;
  ulong uVar2;
  time_t tVar3;
  uint uVar4;
  long lVar5;
  bool bVar6;
  tm local_38;
  
  local_38.tm_gmtoff = 0;
  local_38.tm_zone = (char *)0x0;
  local_38.tm_wday = 0;
  local_38.tm_yday = 0;
  local_38.tm_isdst = 0;
  local_38._36_4_ = 0;
  if ((n == 0x14) && (uVar4 = (int)*p - 0x30, uVar4 < 10)) {
    lVar1 = 0;
    lVar5 = 1;
    do {
      lVar1 = (ulong)uVar4 + lVar1 * 10;
      uVar4 = (int)p[lVar5] - 0x30;
      if (9 < uVar4) break;
      bVar6 = lVar5 != 4;
      lVar5 = lVar5 + 1;
    } while (bVar6);
    if (((0x76b < lVar1) && (local_38.tm_year = (int)lVar1 + -0x76c, p[4] == '-')) &&
       (uVar4 = (int)p[5] - 0x30, uVar4 < 10)) {
      lVar1 = 0;
      lVar5 = 0;
      do {
        lVar1 = (ulong)uVar4 + lVar1 * 10;
        uVar4 = (int)p[lVar5 + 6] - 0x30;
        if (9 < uVar4) break;
        bVar6 = lVar5 != 1;
        lVar5 = lVar5 + 1;
      } while (bVar6);
      if (((0xfffffffffffffff3 < lVar1 - 0xdU) && (local_38.tm_mon = (int)lVar1 + -1, p[7] == '-'))
         && (uVar4 = (int)p[8] - 0x30, uVar4 < 10)) {
        lVar1 = 0;
        lVar5 = 0;
        do {
          lVar1 = (ulong)uVar4 + lVar1 * 10;
          uVar4 = (int)p[lVar5 + 9] - 0x30;
          if (9 < uVar4) break;
          bVar6 = lVar5 != 1;
          lVar5 = lVar5 + 1;
        } while (bVar6);
        if ((0xffffffffffffffe0 < lVar1 - 0x20U) && (local_38.tm_mday = (int)lVar1, p[10] == 'T')) {
          uVar4 = (int)p[0xb] - 0x30;
          if (uVar4 < 10) {
            uVar2 = 0;
            lVar1 = 0;
            do {
              uVar2 = (ulong)uVar4 + uVar2 * 10;
              uVar4 = (int)p[lVar1 + 0xc] - 0x30;
              if (9 < uVar4) break;
              bVar6 = lVar1 != 1;
              lVar1 = lVar1 + 1;
            } while (bVar6);
            if (0x17 < uVar2) {
              return 0;
            }
          }
          else {
            uVar2 = 0;
          }
          local_38.tm_hour = (int)uVar2;
          if (p[0xd] == ':') {
            uVar4 = (int)p[0xe] - 0x30;
            if (uVar4 < 10) {
              uVar2 = 0;
              lVar1 = 0;
              do {
                uVar2 = (ulong)uVar4 + uVar2 * 10;
                uVar4 = (int)p[lVar1 + 0xf] - 0x30;
                if (9 < uVar4) break;
                bVar6 = lVar1 != 1;
                lVar1 = lVar1 + 1;
              } while (bVar6);
              if (0x3b < uVar2) {
                return 0;
              }
            }
            else {
              uVar2 = 0;
            }
            local_38.tm_min = (int)uVar2;
            if (p[0x10] == ':') {
              uVar4 = (int)p[0x11] - 0x30;
              if (uVar4 < 10) {
                uVar2 = 0;
                lVar1 = 0;
                do {
                  uVar2 = (ulong)uVar4 + uVar2 * 10;
                  uVar4 = (int)p[lVar1 + 0x12] - 0x30;
                  if (9 < uVar4) break;
                  bVar6 = lVar1 != 1;
                  lVar1 = lVar1 + 1;
                } while (bVar6);
                if (0x3c < uVar2) {
                  return 0;
                }
              }
              else {
                uVar2 = 0;
              }
              local_38.tm_sec = (int)uVar2;
              tVar3 = timegm(&local_38);
              return tVar3;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static time_t
parse_time(const char *p, size_t n)
{
	struct tm tm;
	time_t t = 0;
	int64_t data;

	memset(&tm, 0, sizeof(tm));
	if (n != 20)
		return (t);
	data = atol10(p, 4);
	if (data < 1900)
		return (t);
	tm.tm_year = (int)data - 1900;
	p += 4;
	if (*p++ != '-')
		return (t);
	data = atol10(p, 2);
	if (data < 1 || data > 12)
		return (t);
	tm.tm_mon = (int)data -1;
	p += 2;
	if (*p++ != '-')
		return (t);
	data = atol10(p, 2);
	if (data < 1 || data > 31)
		return (t);
	tm.tm_mday = (int)data;
	p += 2;
	if (*p++ != 'T')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 23)
		return (t);
	tm.tm_hour = (int)data;
	p += 2;
	if (*p++ != ':')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 59)
		return (t);
	tm.tm_min = (int)data;
	p += 2;
	if (*p++ != ':')
		return (t);
	data = atol10(p, 2);
	if (data < 0 || data > 60)
		return (t);
	tm.tm_sec = (int)data;
#if 0
	p += 2;
	if (*p != 'Z')
		return (t);
#endif

	t = time_from_tm(&tm);

	return (t);
}